

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.npatch.c
# Opt level: O0

void snga_acc_patch_values
               (Integer type,void *alpha,Integer ndim,Integer *loC,Integer *hiC,Integer *ldC,
               void *A_ptr,void *C_ptr)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined8 uVar5;
  double *pdVar6;
  long *in_RCX;
  long in_RDX;
  double *in_RSI;
  undefined8 in_RDI;
  long *in_R8;
  long *in_R9;
  long in_stack_00000008;
  SingleComplex x_1;
  SingleComplex a_1;
  DoubleComplex x;
  DoubleComplex a;
  Integer j;
  Integer i;
  Integer n1dim;
  Integer idx;
  Integer baseldC [7];
  Integer bunit [7];
  Integer bvalue [7];
  float local_138;
  float fStack_134;
  float local_130;
  float fStack_12c;
  long local_108;
  long local_100;
  long local_f8;
  long local_f0;
  long local_e8 [8];
  long local_a8 [8];
  long local_68 [7];
  long *local_30;
  long *local_28;
  long *local_20;
  long local_18;
  double *local_10;
  undefined8 local_8;
  
  local_f8 = 1;
  for (local_100 = 1; local_100 < in_RDX; local_100 = local_100 + 1) {
    local_f8 = ((in_R8[local_100] - in_RCX[local_100]) + 1) * local_f8;
  }
  local_68[0] = 0;
  local_68[1] = 0;
  local_a8[0] = 1;
  local_a8[1] = 1;
  local_e8[0] = *in_R9;
  local_e8[1] = *in_R9 * in_R9[1];
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_100 = 2; local_100 < local_18; local_100 = local_100 + 1) {
    local_68[local_100] = 0;
    local_a8[local_100] =
         local_a8[local_100 + -1] * ((local_28[local_100 + -1] - local_20[local_100 + -1]) + 1);
    local_e8[local_100] = local_e8[local_100 + -1] * local_30[local_100];
  }
  switch(local_8) {
  case 0x3e9:
    for (local_100 = 0; local_100 < local_f8; local_100 = local_100 + 1) {
      local_f0 = 0;
      for (local_108 = 1; local_108 < local_18; local_108 = local_108 + 1) {
        local_f0 = local_68[local_108] * local_e8[local_108 + -1] + local_f0;
        if ((local_100 + 1) % local_a8[local_108] == 0) {
          local_68[local_108] = local_68[local_108] + 1;
        }
        if (local_28[local_108] - local_20[local_108] < local_68[local_108]) {
          local_68[local_108] = 0;
        }
      }
      for (local_108 = 0; local_108 < (*local_28 - *local_20) + 1; local_108 = local_108 + 1) {
        *(int *)((long)x_1 + (local_f0 + local_108) * 4) =
             *(int *)((long)x_1 + (local_f0 + local_108) * 4) +
             (int)*(float *)local_10 * *(int *)(in_stack_00000008 + (local_f0 + local_108) * 4);
      }
    }
    break;
  case 0x3ea:
    for (local_100 = 0; local_100 < local_f8; local_100 = local_100 + 1) {
      local_f0 = 0;
      for (local_108 = 1; local_108 < local_18; local_108 = local_108 + 1) {
        local_f0 = local_68[local_108] * local_e8[local_108 + -1] + local_f0;
        if ((local_100 + 1) % local_a8[local_108] == 0) {
          local_68[local_108] = local_68[local_108] + 1;
        }
        if (local_28[local_108] - local_20[local_108] < local_68[local_108]) {
          local_68[local_108] = 0;
        }
      }
      for (local_108 = 0; local_108 < (*local_28 - *local_20) + 1; local_108 = local_108 + 1) {
        *(long *)((long)x_1 + (local_f0 + local_108) * 8) =
             *(long *)((long)x_1 + (local_f0 + local_108) * 8) +
             (long)*local_10 * *(long *)(in_stack_00000008 + (local_f0 + local_108) * 8);
      }
    }
    break;
  case 0x3eb:
    for (local_100 = 0; local_100 < local_f8; local_100 = local_100 + 1) {
      local_f0 = 0;
      for (local_108 = 1; local_108 < local_18; local_108 = local_108 + 1) {
        local_f0 = local_68[local_108] * local_e8[local_108 + -1] + local_f0;
        if ((local_100 + 1) % local_a8[local_108] == 0) {
          local_68[local_108] = local_68[local_108] + 1;
        }
        if (local_28[local_108] - local_20[local_108] < local_68[local_108]) {
          local_68[local_108] = 0;
        }
      }
      for (local_108 = 0; local_108 < (*local_28 - *local_20) + 1; local_108 = local_108 + 1) {
        *(float *)((long)x_1 + (local_f0 + local_108) * 4) =
             *(float *)local_10 * *(float *)(in_stack_00000008 + (local_f0 + local_108) * 4) +
             *(float *)((long)x_1 + (local_f0 + local_108) * 4);
      }
    }
    break;
  case 0x3ec:
    for (local_100 = 0; local_100 < local_f8; local_100 = local_100 + 1) {
      local_f0 = 0;
      for (local_108 = 1; local_108 < local_18; local_108 = local_108 + 1) {
        local_f0 = local_68[local_108] * local_e8[local_108 + -1] + local_f0;
        if ((local_100 + 1) % local_a8[local_108] == 0) {
          local_68[local_108] = local_68[local_108] + 1;
        }
        if (local_28[local_108] - local_20[local_108] < local_68[local_108]) {
          local_68[local_108] = 0;
        }
      }
      for (local_108 = 0; local_108 < (*local_28 - *local_20) + 1; local_108 = local_108 + 1) {
        *(double *)((long)x_1 + (local_f0 + local_108) * 8) =
             *local_10 * *(double *)(in_stack_00000008 + (local_f0 + local_108) * 8) +
             *(double *)((long)x_1 + (local_f0 + local_108) * 8);
      }
    }
    break;
  default:
    pnga_error((char *)baseldC[0],idx);
    break;
  case 0x3ee:
    for (local_100 = 0; local_100 < local_f8; local_100 = local_100 + 1) {
      local_f0 = 0;
      for (local_108 = 1; local_108 < local_18; local_108 = local_108 + 1) {
        local_f0 = local_68[local_108] * local_e8[local_108 + -1] + local_f0;
        if ((local_100 + 1) % local_a8[local_108] == 0) {
          local_68[local_108] = local_68[local_108] + 1;
        }
        if (local_28[local_108] - local_20[local_108] < local_68[local_108]) {
          local_68[local_108] = 0;
        }
      }
      for (local_108 = 0; local_108 < (*local_28 - *local_20) + 1; local_108 = local_108 + 1) {
        uVar5 = *(undefined8 *)(in_stack_00000008 + (local_f0 + local_108) * 8);
        local_138 = SUB84(*local_10,0);
        local_130 = (float)uVar5;
        fStack_134 = (float)((ulong)*local_10 >> 0x20);
        fStack_12c = (float)((ulong)uVar5 >> 0x20);
        *(float *)((long)x_1 + (local_f0 + local_108) * 8) =
             -fStack_134 * fStack_12c +
             local_138 * local_130 + *(float *)((long)x_1 + (local_f0 + local_108) * 8);
        *(float *)((long)x_1 + 4 + (local_f0 + local_108) * 8) =
             fStack_134 * local_130 +
             local_138 * fStack_12c + *(float *)((long)x_1 + 4 + (local_f0 + local_108) * 8);
      }
    }
    break;
  case 0x3ef:
    for (local_100 = 0; local_100 < local_f8; local_100 = local_100 + 1) {
      local_f0 = 0;
      for (local_108 = 1; local_108 < local_18; local_108 = local_108 + 1) {
        local_f0 = local_68[local_108] * local_e8[local_108 + -1] + local_f0;
        if ((local_100 + 1) % local_a8[local_108] == 0) {
          local_68[local_108] = local_68[local_108] + 1;
        }
        if (local_28[local_108] - local_20[local_108] < local_68[local_108]) {
          local_68[local_108] = 0;
        }
      }
      for (local_108 = 0; local_108 < (*local_28 - *local_20) + 1; local_108 = local_108 + 1) {
        pdVar6 = (double *)(in_stack_00000008 + (local_f0 + local_108) * 0x10);
        dVar1 = *pdVar6;
        dVar2 = pdVar6[1];
        dVar3 = *local_10;
        dVar4 = local_10[1];
        *(double *)((long)x_1 + (local_f0 + local_108) * 0x10) =
             -dVar4 * dVar2 + dVar3 * dVar1 + *(double *)((long)x_1 + (local_f0 + local_108) * 0x10)
        ;
        *(double *)((long)x_1 + (local_f0 + local_108) * 0x10 + 8) =
             dVar4 * dVar1 +
             dVar3 * dVar2 + *(double *)((long)x_1 + (local_f0 + local_108) * 0x10 + 8);
      }
    }
    break;
  case 0x3f8:
    for (local_100 = 0; local_100 < local_f8; local_100 = local_100 + 1) {
      local_f0 = 0;
      for (local_108 = 1; local_108 < local_18; local_108 = local_108 + 1) {
        local_f0 = local_68[local_108] * local_e8[local_108 + -1] + local_f0;
        if ((local_100 + 1) % local_a8[local_108] == 0) {
          local_68[local_108] = local_68[local_108] + 1;
        }
        if (local_28[local_108] - local_20[local_108] < local_68[local_108]) {
          local_68[local_108] = 0;
        }
      }
      for (local_108 = 0; local_108 < (*local_28 - *local_20) + 1; local_108 = local_108 + 1) {
        *(long *)((long)x_1 + (local_f0 + local_108) * 8) =
             *(long *)((long)x_1 + (local_f0 + local_108) * 8) +
             (long)*local_10 * *(long *)(in_stack_00000008 + (local_f0 + local_108) * 8);
      }
    }
  }
  return;
}

Assistant:

static void snga_acc_patch_values(Integer type, void* alpha, Integer ndim,
                                  Integer *loC, Integer *hiC, Integer *ldC,
                                  void *A_ptr, void *C_ptr)
{
  Integer bvalue[MAXDIM], bunit[MAXDIM], baseldC[MAXDIM];
  Integer idx, n1dim;
  Integer i, j;
  /* compute "local" add */

  /* number of n-element of the first dimension */
  n1dim = 1; for(i=1; i<ndim; i++) n1dim *= (hiC[i] - loC[i] + 1);

  /* calculate the destination indices */
  bvalue[0] = 0; bvalue[1] = 0; bunit[0] = 1; bunit[1] = 1;
  /* baseld[0] = ld[0]
   * baseld[1] = ld[0] * ld[1]
   * baseld[2] = ld[0] * ld[1] * ld[2] .....
   */
  baseldC[0] = ldC[0]; baseldC[1] = baseldC[0] *ldC[1];
  for(i=2; i<ndim; i++) {
    bvalue[i] = 0;
    bunit[i] = bunit[i-1] * (hiC[i-1] - loC[i-1] + 1);
    baseldC[i] = baseldC[i-1] * ldC[i];
  }

  switch(type){
    case C_DBL:
      for(i=0; i<n1dim; i++) {
        idx = 0;
        for(j=1; j<ndim; j++) {
          idx += bvalue[j] * baseldC[j-1];
          if(((i+1) % bunit[j]) == 0) bvalue[j]++;
          if(bvalue[j] > (hiC[j]-loC[j])) bvalue[j] = 0;
        }

        for(j=0; j<(hiC[0]-loC[0]+1); j++)
          ((double*)C_ptr)[idx+j] = ((double*)C_ptr)[idx+j]
            + *(double*)alpha * ((double*)A_ptr)[idx+j];
      }
      break;
    case C_DCPL:
      for(i=0; i<n1dim; i++) {
        idx = 0;
        for(j=1; j<ndim; j++) {
          idx += bvalue[j] * baseldC[j-1];
          if(((i+1) % bunit[j]) == 0) bvalue[j]++;
          if(bvalue[j] > (hiC[j]-loC[j])) bvalue[j] = 0;
        }

        for(j=0; j<(hiC[0]-loC[0]+1); j++) {
          DoubleComplex a = ((DoubleComplex *)A_ptr)[idx+j];
          DoubleComplex x= *(DoubleComplex*)alpha;
          ((DoubleComplex *)C_ptr)[idx+j].real =
            ((DoubleComplex *)C_ptr)[idx+j].real
            + x.real*a.real - x.imag*a.imag;
          ((DoubleComplex *)C_ptr)[idx+j].imag =
            ((DoubleComplex *)C_ptr)[idx+j].imag
            + x.real*a.imag + x.imag*a.real;
        }
      }
      break;
    case C_SCPL:
      for(i=0; i<n1dim; i++) {
        idx = 0;
        for(j=1; j<ndim; j++) {
          idx += bvalue[j] * baseldC[j-1];
          if(((i+1) % bunit[j]) == 0) bvalue[j]++;
          if(bvalue[j] > (hiC[j]-loC[j])) bvalue[j] = 0;
        }

        for(j=0; j<(hiC[0]-loC[0]+1); j++) {
          SingleComplex a = ((SingleComplex *)A_ptr)[idx+j];
          SingleComplex x= *(SingleComplex*)alpha;
          ((SingleComplex *)C_ptr)[idx+j].real =
            ((SingleComplex *)C_ptr)[idx+j].real
            + x.real*a.real - x.imag*a.imag;
          ((SingleComplex *)C_ptr)[idx+j].imag =
            ((SingleComplex *)C_ptr)[idx+j].imag
            + x.real*a.imag + x.imag*a.real;
        }
      }
      break;
    case C_INT:
      for(i=0; i<n1dim; i++) {
        idx = 0;
        for(j=1; j<ndim; j++) {
          idx += bvalue[j] * baseldC[j-1];
          if(((i+1) % bunit[j]) == 0) bvalue[j]++;
          if(bvalue[j] > (hiC[j]-loC[j])) bvalue[j] = 0;
        }

        for(j=0; j<(hiC[0]-loC[0]+1); j++)
          ((int*)C_ptr)[idx+j] = ((int*)C_ptr)[idx+j]
            + *(int *)alpha * ((int*)A_ptr)[idx+j];
      }
      break;
    case C_FLOAT:
      for(i=0; i<n1dim; i++) {
        idx = 0;
        for(j=1; j<ndim; j++) {
          idx += bvalue[j] * baseldC[j-1];
          if(((i+1) % bunit[j]) == 0) bvalue[j]++;
          if(bvalue[j] > (hiC[j]-loC[j])) bvalue[j] = 0;
        }

        for(j=0; j<(hiC[0]-loC[0]+1); j++)
          ((float *)C_ptr)[idx+j] = ((float *)C_ptr)[idx+j]
            + *(float *)alpha * ((float *)A_ptr)[idx+j];
      }
      break;
    case C_LONG:
      for(i=0; i<n1dim; i++) {
        idx = 0;
        for(j=1; j<ndim; j++) {
          idx += bvalue[j] * baseldC[j-1];
          if(((i+1) % bunit[j]) == 0) bvalue[j]++;
          if(bvalue[j] > (hiC[j]-loC[j])) bvalue[j] = 0;
        }

        for(j=0; j<(hiC[0]-loC[0]+1); j++)
          ((long *)C_ptr)[idx+j] = ((long *)C_ptr)[idx+j]
            + *(long *)alpha * ((long *)A_ptr)[idx+j];
      }
      break;
    case C_LONGLONG:
      for(i=0; i<n1dim; i++) {
        idx = 0;
        for(j=1; j<ndim; j++) {
          idx += bvalue[j] * baseldC[j-1];
          if(((i+1) % bunit[j]) == 0) bvalue[j]++;
          if(bvalue[j] > (hiC[j]-loC[j])) bvalue[j] = 0;
        }

        for(j=0; j<(hiC[0]-loC[0]+1); j++)
          ((long long*)C_ptr)[idx+j] = ((long long*)C_ptr)[idx+j]
            + *(long long*)alpha * ((long long*)A_ptr)[idx+j];
      }
      break;
    default: pnga_error(" wrong data type ",type);
  }
}